

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetRPATH(cmGeneratorTarget *this,string *config,string *prop,string *rpath)

{
  cmValue cVar1;
  string local_88;
  string local_68;
  string local_48;
  
  cVar1 = GetProperty(this,prop);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_68,(string *)cVar1.Value);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_48,&local_68,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_88);
    std::__cxx11::string::operator=((string *)rpath,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return cVar1.Value != (string *)0x0;
}

Assistant:

bool cmGeneratorTarget::GetRPATH(const std::string& config,
                                 const std::string& prop,
                                 std::string& rpath) const
{
  cmValue value = this->GetProperty(prop);
  if (!value) {
    return false;
  }

  rpath =
    cmGeneratorExpression::Evaluate(*value, this->LocalGenerator, config);

  return true;
}